

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  int iVar1;
  int local_3c;
  int indx;
  int buffer_size;
  xmlChar *out;
  xmlChar *buffer;
  xmlChar *cur;
  xmlC14NNormalizationMode mode_local;
  xmlChar *input_local;
  
  if (input == (xmlChar *)0x0) {
    input_local = (xmlChar *)0x0;
  }
  else {
    local_3c = 1000;
    _indx = (xmlChar *)(*xmlMallocAtomic)(1000);
    out = _indx;
    buffer = input;
    if (_indx == (xmlChar *)0x0) {
      xmlC14NErrMemory("allocating buffer");
      input_local = (xmlChar *)0x0;
    }
    else {
      for (; *buffer != '\0'; buffer = buffer + 1) {
        if ((long)(local_3c + -10) < (long)_indx - (long)out) {
          iVar1 = (int)out;
          local_3c = local_3c << 1;
          out = (xmlChar *)(*xmlRealloc)(out,(long)local_3c);
          if (out == (xmlChar *)0x0) {
            xmlC14NErrMemory("growing buffer");
            return (xmlChar *)0x0;
          }
          _indx = out + ((int)_indx - iVar1);
        }
        if ((*buffer == '<') &&
           ((mode == XMLC14N_NORMALIZE_ATTR || (mode == XMLC14N_NORMALIZE_TEXT)))) {
          builtin_memcpy(_indx,"&lt;",4);
          _indx = _indx + 4;
        }
        else if ((*buffer == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
          builtin_memcpy(_indx,"&gt;",4);
          _indx = _indx + 4;
        }
        else if ((*buffer == '&') &&
                ((mode == XMLC14N_NORMALIZE_ATTR || (mode == XMLC14N_NORMALIZE_TEXT)))) {
          builtin_memcpy(_indx,"&amp;",5);
          _indx = _indx + 5;
        }
        else if ((*buffer == '\"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(_indx,"&quot;",6);
          _indx = _indx + 6;
        }
        else if ((*buffer == '\t') && (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(_indx,"&#x9;",5);
          _indx = _indx + 5;
        }
        else if ((*buffer == '\n') && (mode == XMLC14N_NORMALIZE_ATTR)) {
          builtin_memcpy(_indx,"&#xA;",5);
          _indx = _indx + 5;
        }
        else if ((*buffer == '\r') &&
                ((((mode == XMLC14N_NORMALIZE_ATTR || (mode == XMLC14N_NORMALIZE_TEXT)) ||
                  (mode == XMLC14N_NORMALIZE_COMMENT)) || (mode == XMLC14N_NORMALIZE_PI)))) {
          builtin_memcpy(_indx,"&#xD;",5);
          _indx = _indx + 5;
        }
        else {
          *_indx = *buffer;
          _indx = _indx + 1;
        }
      }
      *_indx = '\0';
      input_local = out;
    }
  }
  return input_local;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	xmlC14NErrMemory("allocating buffer");
        return (NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            int indx = out - buffer;

            growBufferReentrant();
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}